

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_write_crN_x86_64(CPUX86State *env,int reg,target_ulong t0)

{
  uintptr_t unaff_retaddr;
  target_ulong t0_local;
  int reg_local;
  CPUX86State *env_local;
  
  cpu_svm_check_intercept_param_x86_64(env,reg + 0x10,0,unaff_retaddr);
  switch(reg) {
  case 0:
    cpu_x86_update_cr0_x86_64(env,(uint32_t)t0);
    break;
  default:
    env->cr[reg] = t0;
    break;
  case 3:
    cpu_x86_update_cr3_x86_64(env,t0);
    break;
  case 4:
    cpu_x86_update_cr4_x86_64(env,(uint32_t)t0);
    break;
  case 8:
    env->v_tpr = (byte)t0 & 0xf;
  }
  return;
}

Assistant:

void helper_write_crN(CPUX86State *env, int reg, target_ulong t0)
{
    cpu_svm_check_intercept_param(env, SVM_EXIT_WRITE_CR0 + reg, 0, GETPC());
    switch (reg) {
    case 0:
        cpu_x86_update_cr0(env, (uint32_t)t0);
        break;
    case 3:
        cpu_x86_update_cr3(env, t0);
        break;
    case 4:
        cpu_x86_update_cr4(env, (uint32_t)t0);
        break;
    case 8:
#if 0
        if (!(env->hflags2 & HF2_VINTR_MASK)) {
            cpu_set_apic_tpr(env_archcpu(env)->apic_state, t0);
        }
#endif
        env->v_tpr = t0 & 0x0f;
        break;
    default:
        env->cr[reg] = t0;
        break;
    }
}